

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshSelectWeights7(word *t,int nVars,int *pW)

{
  bool bVar1;
  int Cost;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int Cost_1;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  
  iVar9 = 1;
  if (nVars != 7) {
    __assert_fail("nVars == 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                  ,0x111,"int Extra_ThreshSelectWeights7(word *, int, int *)");
  }
  pW[6] = 1;
  do {
    pW[5] = iVar9;
    iVar2 = iVar9;
    do {
      pW[4] = iVar2;
      iVar3 = iVar2;
      do {
        pW[3] = iVar3;
        iVar4 = iVar3;
        do {
          pW[2] = iVar4;
          iVar5 = iVar4;
          do {
            pW[1] = iVar5;
            iVar6 = iVar5;
            do {
              *pW = iVar6;
              iVar7 = iVar6;
              do {
                iVar8 = 10000;
                uVar13 = 0;
                iVar10 = 0;
                while( true ) {
                  uVar12 = (uint)uVar13;
                  if ((t[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
                    lVar11 = 0;
                    iVar14 = 0;
                    do {
                      if ((uVar12 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                        iVar14 = iVar14 + pW[lVar11];
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != 7);
                    if (iVar10 <= iVar14) {
                      iVar10 = iVar14;
                    }
                  }
                  else {
                    lVar11 = 0;
                    iVar14 = 0;
                    do {
                      if ((uVar12 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                        iVar14 = iVar14 + pW[lVar11];
                      }
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != 7);
                    if (iVar14 <= iVar8) {
                      iVar8 = iVar14;
                    }
                  }
                  if (iVar8 <= iVar10) break;
                  uVar13 = (ulong)(uVar12 + 1);
                  if (uVar12 + 1 == 1 << ((byte)nVars & 0x1f)) {
                    return iVar8;
                  }
                }
                *pW = iVar7 + 1;
                bVar1 = iVar7 < 0xd;
                iVar7 = iVar7 + 1;
              } while (bVar1);
              pW[1] = iVar6 + 1;
              bVar1 = iVar6 < 0xd;
              iVar6 = iVar6 + 1;
            } while (bVar1);
            pW[2] = iVar5 + 1;
            bVar1 = iVar5 < 0xd;
            iVar5 = iVar5 + 1;
          } while (bVar1);
          pW[3] = iVar4 + 1;
          bVar1 = iVar4 < 0xd;
          iVar4 = iVar4 + 1;
        } while (bVar1);
        pW[4] = iVar3 + 1;
        bVar1 = iVar3 < 0xd;
        iVar3 = iVar3 + 1;
      } while (bVar1);
      pW[5] = iVar2 + 1;
      bVar1 = iVar2 < 0xd;
      iVar2 = iVar2 + 1;
    } while (bVar1);
    iVar9 = iVar9 + 1;
    pW[6] = iVar9;
    if (iVar9 == 0xe) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights7(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 6;
    assert(nVars == 7);
    for (pW[6] = 1; pW[6] <= Limit; pW[6]++)
        for (pW[5] = pW[6]; pW[5] <= Limit; pW[5]++)
            for (pW[4] = pW[5]; pW[4] <= Limit; pW[4]++)
                for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
                    for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                        for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                            for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                                Lmin = 10000;
                                Lmax = 0;
                                for (m = 0; m < nMints; m++) {
                                    if (Abc_TtGetBit(t, m))
                                        Lmin = Abc_MinInt(Lmin,
                                                Extra_ThreshWeightedSum(pW,
                                                        nVars, m));
                                    else
                                        Lmax = Abc_MaxInt(Lmax,
                                                Extra_ThreshWeightedSum(pW,
                                                        nVars, m));
                                    if (Lmax >= Lmin)
                                        break;
                                }
                                if (m < nMints)
                                    continue;
                                assert(Lmax < Lmin);
                                return Lmin;
                            }
    return 0;
}